

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_new(REF_AGENTS ref_agents,REF_INT *id)

{
  int iVar1;
  REF_AGENT_STRUCT *pRVar2;
  int local_30;
  int local_2c;
  REF_INT extra;
  REF_INT chunk;
  REF_INT orig;
  REF_INT *id_local;
  REF_AGENTS ref_agents_local;
  
  if (ref_agents->blank == -1) {
    iVar1 = ref_agents->max;
    if ((int)((double)iVar1 * 1.5) < 5000) {
      local_30 = 5000;
    }
    else {
      local_30 = (int)((double)iVar1 * 1.5);
    }
    ref_agents->max = iVar1 + local_30;
    fflush(_stdout);
    if (0 < ref_agents->max) {
      pRVar2 = (REF_AGENT_STRUCT *)realloc(ref_agents->agent,(long)ref_agents->max * 0x68);
      ref_agents->agent = pRVar2;
    }
    local_2c = iVar1;
    if (ref_agents->agent == (REF_AGENT_STRUCT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x7b
             ,"ref_agents_new","realloc ref_agents->agent NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_agents->max
             ,(long)ref_agents->max,0x68,(long)ref_agents->max * 0x68);
      return 2;
    }
    for (; local_2c < ref_agents->max; local_2c = local_2c + 1) {
      ref_agents->agent[local_2c].mode = REF_AGENT_UNUSED;
      ref_agents->agent[local_2c].previous = -1;
      ref_agents->agent[local_2c].next = local_2c + 1;
    }
    ref_agents->agent[ref_agents->max + -1].next = -1;
    ref_agents->blank = iVar1;
  }
  *id = ref_agents->blank;
  ref_agents->blank = ref_agents->agent[*id].next;
  if (ref_agents->last != -1) {
    ref_agents->agent[ref_agents->last].next = *id;
  }
  ref_agents->agent[*id].mode = REF_AGENT_NEW;
  ref_agents->agent[*id].previous = ref_agents->last;
  ref_agents->agent[*id].next = -1;
  ref_agents->last = *id;
  ref_agents->n = ref_agents->n + 1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_agents_new(REF_AGENTS ref_agents, REF_INT *id) {
  if (REF_EMPTY == ref_agents->blank) {
    REF_INT orig, chunk, extra;
    orig = ref_agents->max;
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_agents->max = orig + chunk;
    ref_realloc(ref_agents->agent, ref_agents->max, REF_AGENT_STRUCT);

    for (extra = orig; extra < ref_agents->max; extra++) {
      ref_agent_mode(ref_agents, extra) = REF_AGENT_UNUSED;
      ref_agent_previous(ref_agents, extra) = REF_EMPTY;
      ref_agent_next(ref_agents, extra) = extra + 1;
    }
    ref_agent_next(ref_agents, ref_agents_max(ref_agents) - 1) = REF_EMPTY;
    ref_agents->blank = orig;
  }

  *id = ref_agents->blank;
  ref_agents->blank = ref_agent_next(ref_agents, *id);

  if (REF_EMPTY != ref_agents->last)
    ref_agent_next(ref_agents, ref_agents->last) = *id;

  ref_agent_mode(ref_agents, *id) = REF_AGENT_NEW;
  ref_agent_previous(ref_agents, *id) = ref_agents->last;
  ref_agent_next(ref_agents, *id) = REF_EMPTY;

  ref_agents->last = *id;

  ref_agents_n(ref_agents)++;

  return REF_SUCCESS;
}